

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall CLayer::~CLayer(CLayer *this)

{
  CGrid *pCVar1;
  CGrid *pCVar2;
  int iVar3;
  CDesign *pCVar4;
  CGrid *this_00;
  int local_14;
  int i;
  CLayer *this_local;
  
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CLayer_001cdba0;
  local_14 = 0;
  while( true ) {
    pCVar4 = CObject::GetDesign();
    iVar3 = CBBox::W(&pCVar4->super_CBBox);
    if (iVar3 <= local_14) break;
    if (this->m_ppGrid[local_14] != (CGrid *)0x0) {
      pCVar1 = this->m_ppGrid[local_14];
      if (pCVar1 != (CGrid *)0x0) {
        pCVar2 = pCVar1[-1].m_pAdjGrid[3];
        this_00 = pCVar1 + (long)pCVar2;
        while (pCVar1 != this_00) {
          this_00 = this_00 + -1;
          CGrid::~CGrid(this_00);
        }
        operator_delete__(pCVar1[-1].m_pAdjGrid + 3,(long)pCVar2 * 0x98 + 8);
      }
      this->m_ppGrid[local_14] = (CGrid *)0x0;
    }
    local_14 = local_14 + 1;
  }
  if (this->m_ppGrid != (CGrid **)0x0) {
    if (this->m_ppGrid != (CGrid **)0x0) {
      operator_delete__(this->m_ppGrid);
    }
    this->m_ppGrid = (CGrid **)0x0;
  }
  if (this->m_pMaze != (uchar *)0x0) {
    if (this->m_pMaze != (uchar *)0x0) {
      operator_delete__(this->m_pMaze);
    }
    this->m_pMaze = (uchar *)0x0;
  }
  __gnu_cxx::
  hash_map<long_long,_std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>_>
  ::~hash_map(&this->m_CBoundaryBucketItr);
  std::
  multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>::
  ~multimap(&this->m_CBoundaryBucket);
  CObject::~CObject(&this->super_CObject);
  return;
}

Assistant:

CLayer::~CLayer()
{
	for (int i=0;i<GetDesign()->W();++i)	SAFE_DELA(m_ppGrid[i]);
	SAFE_DELA(m_ppGrid);

	//for (int i=0;i<m_iMaxBX;++i)	SAFE_DELA(m_ppBoundary[i]);

	//SAFE_DELA(m_ppBoundary);
	SAFE_DELA(m_pMaze);
}